

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O2

bool Inferences::InductionHelper::isInductionForInfiniteIntervalsOn(void)

{
  bool bVar1;
  int iVar2;
  
  if (isInductionForInfiniteIntervalsOn()::infinite == '\0') {
    iVar2 = __cxa_guard_acquire(&isInductionForInfiniteIntervalsOn()::infinite);
    if (iVar2 != 0) {
      isInductionForInfiniteIntervalsOn::infinite = (*(uint *)(Lib::env + 0x64a0) & 0xfffffffd) == 0
      ;
      __cxa_guard_release(&isInductionForInfiniteIntervalsOn()::infinite);
    }
  }
  bVar1 = isIntInductionOn();
  return (bool)(bVar1 & isInductionForInfiniteIntervalsOn::infinite);
}

Assistant:

bool InductionHelper::isInductionForInfiniteIntervalsOn() {
  static bool infinite = env.options->integerInductionInterval() == Options::IntegerInductionInterval::INFINITE ||
                         env.options->integerInductionInterval() == Options::IntegerInductionInterval::BOTH;
  return isIntInductionOn() && infinite;
}